

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O2

CEExecOptions * __thiscall CEExecOptions::GenObserver(CEExecOptions *this)

{
  CLOptions *in_RSI;
  _Base_ptr p_Var1;
  double dVar2;
  allocator local_93;
  allocator local_92;
  allocator local_91;
  string local_90;
  double local_70;
  double local_68;
  CEAngleType local_5c;
  string local_58;
  string local_38;
  double local_18;
  
  std::__cxx11::string::string((string *)&local_90,"longitude",&local_91);
  local_68 = CLOptions::AsDouble(in_RSI,&local_90);
  std::__cxx11::string::string((string *)&local_58,"latitude",&local_92);
  local_70 = CLOptions::AsDouble(in_RSI,&local_58);
  std::__cxx11::string::string((string *)&local_38,"elevation",&local_93);
  local_18 = CLOptions::AsDouble(in_RSI,&local_38);
  local_5c = DEGREES;
  CEObserver::CEObserver((CEObserver *)this,&local_68,&local_70,&local_18,&local_5c);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_90,"humidity",(allocator *)&local_58);
  p_Var1 = (_Base_ptr)CLOptions::AsDouble(in_RSI,&local_90);
  (this->super_CLOptions).params_bools._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       p_Var1;
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_90,"pressure",(allocator *)&local_58);
  dVar2 = CLOptions::AsDouble(in_RSI,&local_90);
  *(double *)&(this->super_CLOptions).params_bools._M_t._M_impl = dVar2;
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_90,"wavelength",(allocator *)&local_58);
  p_Var1 = (_Base_ptr)CLOptions::AsDouble(in_RSI,&local_90);
  (this->super_CLOptions).params_bools._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var1
  ;
  std::__cxx11::string::~string((string *)&local_90);
  return this;
}

Assistant:

inline
CEObserver CEExecOptions::GenObserver(void)
{
    CEObserver obs(AsDouble("longitude"),
                   AsDouble("latitude"),
                   AsDouble("elevation"),
                   CEAngleType::DEGREES);
    obs.SetRelativeHumidity(AsDouble("humidity"));
    obs.SetPressure_hPa(AsDouble("pressure"));
    obs.SetWavelength_um(AsDouble("wavelength"));

    return obs;
}